

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reply_set.c
# Opt level: O0

int mpt_reply_set(mpt_reply_data *rd,size_t len,void *data)

{
  void *data_local;
  size_t len_local;
  mpt_reply_data *rd_local;
  
  if (rd->_max < len) {
    rd_local._4_4_ = -2;
  }
  else {
    if (data == (void *)0x0) {
      memset(rd->val,0,len);
    }
    else {
      memcpy(rd->val,data,len);
    }
    rd->len = (uint16_t)len;
    rd_local._4_4_ = (uint)rd->_max - (int)len;
  }
  return rd_local._4_4_;
}

Assistant:

extern int mpt_reply_set(MPT_INTERFACE(reply_data) *rd, size_t len, const void *data)
{
	if (len > rd->_max) {
		return MPT_ERROR(BadValue);
	}
	if (data) {
		memcpy(rd->val, data, len);
	} else {
		memset(rd->val, 0, len);
	}
	rd->len = len;
	
	return rd->_max - len;
}